

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_plte(spng_ctx *ctx,spng_plte *plte)

{
  spng_chunk_bitfield sVar1;
  int iVar2;
  
  if (plte == (spng_plte *)0x0 || ctx == (spng_ctx *)0x0) {
    return 1;
  }
  if ((ctx->data != (uchar *)0x0) || (iVar2 = 0x52, (ctx->field_0xcc & 0x10) != 0)) {
    iVar2 = read_chunks(ctx,0);
    if (iVar2 == 0) {
      sVar1 = ctx->stored;
      if (((uint)sVar1 & 1) == 0) {
        iVar2 = 1;
      }
      else {
        iVar2 = 1;
        if ((0xfffffeff < plte->n_entries - 0x101) &&
           (((ctx->ihdr).color_type != '\x03' ||
            (plte->n_entries <= (uint)(1 << ((ctx->ihdr).bit_depth & 0x1f)))))) {
          (ctx->plte).n_entries = plte->n_entries;
          memcpy((ctx->plte).entries,plte->entries,(ulong)plte->n_entries << 2);
          ctx->stored = (spng_chunk_bitfield)((uint)sVar1 | 2);
          *(byte *)&ctx->user = *(byte *)&ctx->user | 2;
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int spng_set_plte(spng_ctx *ctx, struct spng_plte *plte)
{
    SPNG_SET_CHUNK_BOILERPLATE(plte);

    if(!ctx->stored.ihdr) return 1;

    if(check_plte(plte, &ctx->ihdr)) return 1;

    ctx->plte.n_entries = plte->n_entries;

    memcpy(ctx->plte.entries, plte->entries, plte->n_entries * sizeof(struct spng_plte_entry));

    ctx->stored.plte = 1;
    ctx->user.plte = 1;

    return 0;
}